

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

bool __thiscall rw::MaterialList::streamWrite(MaterialList *this,Stream *stream)

{
  Material **ppMVar1;
  long lVar2;
  uint32 size;
  ulong uVar3;
  long lVar4;
  int32 i;
  ulong uVar5;
  long lVar6;
  
  size = streamGetSize(this);
  writeChunkHeader(stream,8,size);
  writeChunkHeader(stream,1,this->numMaterials * 4 + 4);
  Stream::writeI32(stream,this->numMaterials);
  uVar5 = 0;
  do {
    uVar3 = (ulong)this->numMaterials;
    if ((long)uVar3 <= (long)uVar5) {
      lVar6 = 0;
      do {
        if ((int)uVar3 <= lVar6) {
          return true;
        }
        ppMVar1 = this->materials;
        lVar4 = lVar6;
        do {
          if (lVar4 < 1) {
            Material::streamWrite(ppMVar1[lVar6],stream);
            uVar3 = (ulong)(uint)this->numMaterials;
            break;
          }
          lVar2 = lVar4 + -1;
          lVar4 = lVar4 + -1;
        } while (ppMVar1[lVar6] != ppMVar1[lVar2]);
        lVar6 = lVar6 + 1;
      } while( true );
    }
    uVar3 = uVar5;
    do {
      if ((long)uVar3 < 1) {
        uVar3 = 0xffffffff;
        break;
      }
      uVar3 = uVar3 - 1;
    } while (this->materials[uVar5] != this->materials[uVar3 & 0xffffffff]);
    Stream::writeI32(stream,(int32)uVar3);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool
MaterialList::streamWrite(Stream *stream)
{
	uint32 size = this->streamGetSize();
	writeChunkHeader(stream, ID_MATLIST, size);
	writeChunkHeader(stream, ID_STRUCT, 4 + this->numMaterials*4);
	stream->writeI32(this->numMaterials);

	int32 idx;
	for(int32 i = 0; i < this->numMaterials; i++){
		idx = -1;
		for(int32 j = i-1; j >= 0; j--)
			if(this->materials[i] == this->materials[j]){
				idx = j;
				break;
			}
		stream->writeI32(idx);
	}
	for(int32 i = 0; i < this->numMaterials; i++){
		for(int32 j = i-1; j >= 0; j--)
			if(this->materials[i] == this->materials[j])
				goto found;
		this->materials[i]->streamWrite(stream);
		found:;
	}
	return true;
}